

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

void Gia_ManAreCompress(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  Gia_PtrAre_t GVar1;
  Gia_PtrAre_t GVar2;
  uint *puVar3;
  uint **ppuVar4;
  
  GVar2 = *pRoot;
  if (((uint)GVar2 & 0x7fffffff) != 0) {
    *pRoot = (Gia_PtrAre_t)((uint)GVar2 & 0x80000000);
    ppuVar4 = p->ppStas;
    puVar3 = (uint *)((long)p->nSize * (ulong)((uint)GVar2 & 0xfffff) * 4 +
                     *(long *)((long)ppuVar4 + (ulong)((uint)GVar2 >> 0x11 & 0x3ff8)));
    while (*ppuVar4 != puVar3) {
      GVar1 = *(Gia_PtrAre_t *)(puVar3 + 1);
      if (-1 < (int)*puVar3) {
        *(Gia_PtrAre_t *)(puVar3 + 1) = *pRoot;
        *pRoot = GVar2;
      }
      ppuVar4 = p->ppStas;
      GVar2 = GVar1;
      puVar3 = (uint *)((long)p->nSize * (ulong)((uint)GVar1 & 0xfffff) * 4 +
                       *(long *)((long)ppuVar4 + (ulong)((uint)GVar1 >> 0x11 & 0x3ff8)));
    }
    return;
  }
  __assert_fail("pRoot->nItem || pRoot->nPage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                ,0x3b1,"void Gia_ManAreCompress(Gia_ManAre_t *, Gia_PtrAre_t *)");
}

Assistant:

static inline void Gia_ManAreCompress( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iList = *pRoot;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pRoot->nItem = 0; 
    pRoot->nPage = 0;
    for ( iCube = iList, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        pCube->iNext = *pRoot;
        *pRoot = iCube;
    }
}